

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O0

BN * gcdEuclidean(BN *__return_storage_ptr__,BN *a,BN *b)

{
  bool bVar1;
  BN local_38;
  BN *local_20;
  BN *b_local;
  BN *a_local;
  
  local_20 = b;
  b_local = a;
  a_local = __return_storage_ptr__;
  while( true ) {
    bVar1 = BN::is0(b);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    BN::operator%(&local_38,a,b);
    BN::operator=(a,&local_38);
    BN::~BN(&local_38);
    BN::swap(a,b);
  }
  BN::BN(__return_storage_ptr__,a);
  return __return_storage_ptr__;
}

Assistant:

BN gcdEuclidean(BN a,BN b)
{
    while(!b.is0()) {
        a = a % b;
        a.swap(b);
    }
    return a;
}